

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

Status __thiscall leveldb::VersionSet::Recover(VersionSet *this,bool *save_manifest)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Env *env;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Status SVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  char *__s;
  Version *v;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined1 *in_RDX;
  bool bVar10;
  pointer ppVar11;
  bool bVar12;
  VersionSet *this_00;
  bool bVar13;
  long in_FS_OFFSET;
  Slice record;
  LogReporter reporter;
  SequentialFile *file;
  Status s;
  Reader reader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  VersionEdit edit;
  string scratch;
  Builder builder;
  string dscname;
  string current;
  ulong local_3d0;
  pointer local_3c8;
  pointer local_3c0;
  pointer local_3b8;
  Slice local_3a8;
  Slice local_398;
  Status local_388;
  Slice local_380;
  Reporter local_370;
  leveldb *local_368;
  SequentialFile *local_360;
  Status local_358;
  Reader local_350;
  undefined1 local_2f8 [32];
  VersionEdit local_2d8;
  string local_230;
  undefined1 local_210 [408];
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  size_type local_38;
  
  local_38 = *(size_type *)(in_FS_OFFSET + 0x28);
  local_58._0_8_ = &local_48;
  local_58._8_8_ = 0;
  local_48._M_local_buf[0] = '\0';
  env = *(Env **)save_manifest;
  CurrentFileName((string *)local_210,(string *)(save_manifest + 8));
  ReadFileToString((leveldb *)&local_358,env,(string *)local_210,(string *)local_58);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_210 + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._0_8_ != paVar1) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358.state_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    this->env_ = (Env *)local_358.state_;
    local_358.state_ = (char *)0x0;
    goto LAB_0067b3b0;
  }
  if ((local_58._8_8_ == 0) || (*(char *)(local_58._0_8_ + (local_58._8_8_ - 1)) != '\n')) {
    local_210._0_8_ = "CURRENT file does not end with newline";
    local_210._8_8_ = (Version *)0x26;
    local_2d8.comparator_._M_dataplus._M_p = "";
    local_2d8.comparator_._M_string_length = 0;
    Status::Status((Status *)this,kCorruption,(Slice *)local_210,(Slice *)(local_2f8 + 0x20));
    goto LAB_0067b3b0;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             local_58._8_8_ - 1,'\0');
  local_210._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_210,*(long *)(save_manifest + 8),
             *(long *)(save_manifest + 0x10) + *(long *)(save_manifest + 8));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,"/");
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                     (char *)local_58._0_8_,local_58._8_8_);
  local_78._0_8_ = &local_68;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar8->_M_dataplus)._M_p;
  paVar9 = &pbVar8->field_2;
  if (paVar2 == paVar9) {
    local_68._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_68._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_68._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_78._0_8_ = paVar2;
  }
  local_78._8_8_ = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._0_8_ != paVar1) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  (**(code **)(**(long **)save_manifest + 0x10))
            (local_210,*(long **)save_manifest,local_78,&local_360);
  SVar3.state_ = local_358.state_;
  local_358.state_ = (char *)local_210._0_8_;
  local_210._0_8_ = SVar3.state_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)SVar3.state_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(SVar3.state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358.state_ ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    Builder::Builder((Builder *)local_210,(VersionSet *)save_manifest,
                     *(Version **)(save_manifest + 0x168));
    local_370._vptr_Reporter = (_func_int **)&PTR__Reporter_00b3e540;
    local_368 = (leveldb *)&local_358;
    log::Reader::Reader(&local_350,local_360,&local_370,true,0);
    local_380.data_ = "";
    bVar6 = false;
    local_380.size_ = 0;
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    local_230._M_string_length = 0;
    local_230.field_2._M_local_buf[0] = '\0';
    bVar13 = false;
    bVar12 = false;
    bVar10 = false;
    local_3b8 = (pointer)0x0;
    local_3c0 = (pointer)0x0;
    local_3d0 = 0;
    local_3c8 = (pointer)0x0;
    while (bVar5 = log::Reader::ReadRecord(&local_350,&local_380,&local_230),
          bVar5 && (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_358.state_ ==
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0) {
      VersionEdit::VersionEdit((VersionEdit *)(local_2f8 + 0x20));
      VersionEdit::DecodeFrom((VersionEdit *)local_2f8,(Slice *)(local_2f8 + 0x20));
      SVar3.state_ = local_358.state_;
      local_358.state_ = (char *)local_2f8._0_8_;
      local_2f8._0_8_ = SVar3.state_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)SVar3.state_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete__(SVar3.state_);
      }
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_358.state_ ==
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0) && (local_2d8.has_comparator_ == true)) {
        __s = (char *)(**(code **)(**(long **)(save_manifest + 0x40) + 0x18))();
        iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_2f8 + 0x20),__s);
        if (iVar7 != 0) {
          local_2f8._0_8_ = local_2f8 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2f8,local_2d8.comparator_._M_dataplus._M_p,
                     local_2d8.comparator_._M_dataplus._M_p + local_2d8.comparator_._M_string_length
                    );
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
                     " does not match existing comparator ");
          local_398.data_._0_4_ = local_2f8._0_4_;
          local_398.data_._4_4_ = local_2f8._4_4_;
          local_398.size_._0_4_ = local_2f8._8_4_;
          local_398.size_._4_4_ = local_2f8._12_4_;
          local_3a8.data_ = (char *)(**(code **)(**(long **)(save_manifest + 0x40) + 0x18))();
          local_3a8.size_ = strlen(local_3a8.data_);
          Status::Status(&local_388,kInvalidArgument,&local_398,&local_3a8);
          SVar3.state_ = local_358.state_;
          local_358.state_ = local_388.state_;
          local_388.state_ = SVar3.state_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)SVar3.state_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete__(SVar3.state_);
          }
          if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
            operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358.state_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        Builder::Apply((Builder *)local_210,(VersionEdit *)(local_2f8 + 0x20));
      }
      if (local_2d8.has_log_number_ != false) {
        bVar6 = true;
        local_3d0 = local_2d8.log_number_;
      }
      if (local_2d8.has_prev_log_number_ != false) {
        bVar13 = true;
        local_3c8 = (pointer)local_2d8.prev_log_number_;
      }
      if (local_2d8.has_next_file_number_ != false) {
        bVar12 = true;
        local_3b8 = (pointer)local_2d8.next_file_number_;
      }
      if (local_2d8.has_last_sequence_ != false) {
        bVar10 = true;
        local_3c0 = (pointer)local_2d8.last_sequence_;
      }
      VersionEdit::~VersionEdit((VersionEdit *)(local_2f8 + 0x20));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,
                      CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                               local_230.field_2._M_local_buf[0]) + 1);
    }
    log::Reader::~Reader(&local_350);
    log::Reader::Reporter::~Reporter(&local_370);
    if (local_360 != (SequentialFile *)0x0) {
      (*local_360->_vptr_SequentialFile[1])();
    }
    local_360 = (SequentialFile *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.state_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (bVar12) {
        if (!bVar6) {
          local_2d8.comparator_._M_dataplus._M_p = "no meta-lognumber entry in descriptor";
          local_2d8.comparator_._M_string_length = 0x25;
          local_350.file_ = (SequentialFile *)0x8a9dc6;
          local_350.reporter_ = (Reporter *)0x0;
          Status::Status((Status *)&local_230,kCorruption,(Slice *)(local_2f8 + 0x20),
                         (Slice *)&local_350);
          _Var4._M_p = local_230._M_dataplus._M_p;
          local_230._M_dataplus._M_p = local_358.state_;
          goto joined_r0x0067b257;
        }
        if (!bVar10) {
          local_2d8.comparator_._M_dataplus._M_p = "no last-sequence-number entry in descriptor";
          local_2d8.comparator_._M_string_length = 0x2b;
          local_350.file_ = (SequentialFile *)0x8a9dc6;
          local_350.reporter_ = (Reporter *)0x0;
          Status::Status((Status *)&local_230,kCorruption,(Slice *)(local_2f8 + 0x20),
                         (Slice *)&local_350);
          _Var4._M_p = local_230._M_dataplus._M_p;
          local_230._M_dataplus._M_p = local_358.state_;
          goto joined_r0x0067b257;
        }
      }
      else {
        local_2d8.comparator_._M_dataplus._M_p = "no meta-nextfile entry in descriptor";
        local_2d8.comparator_._M_string_length = 0x24;
        local_350.file_ = (SequentialFile *)0x8a9dc6;
        local_350.reporter_ = (Reporter *)0x0;
        Status::Status((Status *)&local_230,kCorruption,(Slice *)(local_2f8 + 0x20),
                       (Slice *)&local_350);
        _Var4._M_p = local_230._M_dataplus._M_p;
        local_230._M_dataplus._M_p = local_358.state_;
joined_r0x0067b257:
        local_358.state_ = _Var4._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete__(local_230._M_dataplus._M_p);
        }
      }
      ppVar11 = (pointer)0x0;
      if (bVar13) {
        ppVar11 = local_3c8;
      }
      if (*(pointer *)(save_manifest + 0x48) <= ppVar11) {
        *(undefined1 **)(save_manifest + 0x48) = (undefined1 *)((long)&ppVar11->first + 1);
      }
      local_3c8 = ppVar11;
      if (*(ulong *)(save_manifest + 0x48) <= local_3d0) {
        *(ulong *)(save_manifest + 0x48) = local_3d0 + 1;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.state_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      v = (Version *)operator_new(0xe8);
      v->vset_ = (VersionSet *)save_manifest;
      v->next_ = v;
      v->prev_ = v;
      v->refs_ = 0;
      memset(v->files_,0,0xb0);
      v->file_to_compact_level_ = -1;
      v->compaction_score_ = -1.0;
      v->compaction_level_ = -1;
      this_00 = (VersionSet *)local_210;
      Builder::SaveTo((Builder *)this_00,v);
      Finalize(this_00,v);
      AppendVersion((VersionSet *)save_manifest,v);
      *(pointer *)(save_manifest + 0x50) = local_3b8;
      *(undefined1 **)(save_manifest + 0x48) = (undefined1 *)((long)&local_3b8->first + 1);
      *(pointer *)(save_manifest + 0x58) = local_3c0;
      *(ulong *)(save_manifest + 0x60) = local_3d0;
      *(pointer *)(save_manifest + 0x68) = local_3c8;
      bVar6 = ReuseManifest((VersionSet *)save_manifest,(string *)local_78,(string *)local_58);
      if (!bVar6) {
        *in_RDX = 1;
      }
    }
    this->env_ = (Env *)local_358.state_;
    local_358.state_ = (char *)0x0;
    Builder::~Builder((Builder *)local_210);
  }
  else if (local_358.state_[4] == '\x01') {
    local_2d8.comparator_._M_dataplus._M_p = "CURRENT points to a non-existent file";
    local_2d8.comparator_._M_string_length = 0x25;
    Status::ToString_abi_cxx11_((string *)local_210,&local_358);
    local_350.file_ = (SequentialFile *)local_210._0_8_;
    local_350.reporter_ = (Reporter *)local_210._8_8_;
    Status::Status((Status *)this,kCorruption,(Slice *)(local_2f8 + 0x20),(Slice *)&local_350);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._0_8_ != paVar1) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
    }
  }
  else {
    this->env_ = (Env *)local_358.state_;
    local_358.state_ = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,local_68._0_8_ + 1);
  }
LAB_0067b3b0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358.state_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(local_358.state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,
                    CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1);
  }
  if (*(size_type *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status VersionSet::Recover(bool* save_manifest) {
  struct LogReporter : public log::Reader::Reporter {
    Status* status;
    void Corruption(size_t bytes, const Status& s) override {
      if (this->status->ok()) *this->status = s;
    }
  };

  // Read "CURRENT" file, which contains a pointer to the current manifest file
  std::string current;
  Status s = ReadFileToString(env_, CurrentFileName(dbname_), &current);
  if (!s.ok()) {
    return s;
  }
  if (current.empty() || current[current.size() - 1] != '\n') {
    return Status::Corruption("CURRENT file does not end with newline");
  }
  current.resize(current.size() - 1);

  std::string dscname = dbname_ + "/" + current;
  SequentialFile* file;
  s = env_->NewSequentialFile(dscname, &file);
  if (!s.ok()) {
    if (s.IsNotFound()) {
      return Status::Corruption("CURRENT points to a non-existent file",
                                s.ToString());
    }
    return s;
  }

  bool have_log_number = false;
  bool have_prev_log_number = false;
  bool have_next_file = false;
  bool have_last_sequence = false;
  uint64_t next_file = 0;
  uint64_t last_sequence = 0;
  uint64_t log_number = 0;
  uint64_t prev_log_number = 0;
  Builder builder(this, current_);

  {
    LogReporter reporter;
    reporter.status = &s;
    log::Reader reader(file, &reporter, true /*checksum*/,
                       0 /*initial_offset*/);
    Slice record;
    std::string scratch;
    while (reader.ReadRecord(&record, &scratch) && s.ok()) {
      VersionEdit edit;
      s = edit.DecodeFrom(record);
      if (s.ok()) {
        if (edit.has_comparator_ &&
            edit.comparator_ != icmp_.user_comparator()->Name()) {
          s = Status::InvalidArgument(
              edit.comparator_ + " does not match existing comparator ",
              icmp_.user_comparator()->Name());
        }
      }

      if (s.ok()) {
        builder.Apply(&edit);
      }

      if (edit.has_log_number_) {
        log_number = edit.log_number_;
        have_log_number = true;
      }

      if (edit.has_prev_log_number_) {
        prev_log_number = edit.prev_log_number_;
        have_prev_log_number = true;
      }

      if (edit.has_next_file_number_) {
        next_file = edit.next_file_number_;
        have_next_file = true;
      }

      if (edit.has_last_sequence_) {
        last_sequence = edit.last_sequence_;
        have_last_sequence = true;
      }
    }
  }
  delete file;
  file = nullptr;

  if (s.ok()) {
    if (!have_next_file) {
      s = Status::Corruption("no meta-nextfile entry in descriptor");
    } else if (!have_log_number) {
      s = Status::Corruption("no meta-lognumber entry in descriptor");
    } else if (!have_last_sequence) {
      s = Status::Corruption("no last-sequence-number entry in descriptor");
    }

    if (!have_prev_log_number) {
      prev_log_number = 0;
    }

    MarkFileNumberUsed(prev_log_number);
    MarkFileNumberUsed(log_number);
  }

  if (s.ok()) {
    Version* v = new Version(this);
    builder.SaveTo(v);
    // Install recovered version
    Finalize(v);
    AppendVersion(v);
    manifest_file_number_ = next_file;
    next_file_number_ = next_file + 1;
    last_sequence_ = last_sequence;
    log_number_ = log_number;
    prev_log_number_ = prev_log_number;

    // See if we can reuse the existing MANIFEST file.
    if (ReuseManifest(dscname, current)) {
      // No need to save new manifest
    } else {
      *save_manifest = true;
    }
  }

  return s;
}